

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall aggreports::NormalisePeriodWeights(aggreports *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  iVar1 = this->samplesize_;
  if (iVar1 != 0) {
    for (p_Var2 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header
        ; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      p_Var2[1]._M_parent = (_Base_ptr)((double)p_Var2[1]._M_parent / (double)iVar1);
    }
  }
  return;
}

Assistant:

void aggreports::NormalisePeriodWeights() {

  if (samplesize_) {
    for (auto iter = periodstoweighting_.begin();
	 iter != periodstoweighting_.end(); ++iter) {
      iter->second /= samplesize_;
    }
  }

}